

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

bool tinyexr::ConvertHeader(EXRHeader *exr_header,HeaderInfo *info,string *warn,string *err)

{
  string *__lhs;
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  EXRChannelInfo *pEVar5;
  int *piVar6;
  EXRAttribute *pEVar7;
  size_t c;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  string asStack_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  exr_header->pixel_aspect_ratio = info->pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info->screen_window_center[0];
  exr_header->screen_window_center[1] = info->screen_window_center[1];
  exr_header->screen_window_width = info->screen_window_width;
  exr_header->chunk_count = info->chunk_count;
  (exr_header->display_window).min_x = (info->display_window).min_x;
  (exr_header->display_window).min_y = (info->display_window).min_y;
  (exr_header->display_window).max_x = (info->display_window).max_x;
  (exr_header->display_window).max_y = (info->display_window).max_y;
  (exr_header->data_window).min_x = (info->data_window).min_x;
  (exr_header->data_window).min_y = (info->data_window).min_y;
  (exr_header->data_window).max_x = (info->data_window).max_x;
  (exr_header->data_window).max_y = (info->data_window).max_y;
  exr_header->line_order = info->line_order;
  exr_header->compression_type = info->compression_type;
  exr_header->tiled = info->tiled;
  exr_header->tile_size_x = info->tile_size_x;
  exr_header->tile_size_y = info->tile_size_y;
  exr_header->tile_level_mode = info->tile_level_mode;
  exr_header->tile_rounding_mode = info->tile_rounding_mode;
  EXRSetNameAttr(exr_header,(info->name)._M_dataplus._M_p);
  if ((info->type)._M_string_length != 0) {
    __lhs = &info->type;
    bVar2 = std::operator==(__lhs,"scanlineimage");
    if (bVar2) {
      if (exr_header->tiled != 0) {
joined_r0x001ab98a:
        if (err != (string *)0x0) {
          std::__cxx11::string::append((char *)err);
        }
        return false;
      }
    }
    else {
      bVar2 = std::operator==(__lhs,"tiledimage");
      if (bVar2) {
        iVar1 = exr_header->tiled;
      }
      else {
        bVar2 = std::operator==(__lhs,"deeptile");
        if (!bVar2) {
          bVar2 = std::operator==(__lhs,"deepscanline");
          if (bVar2) {
            exr_header->non_image = 1;
            if ((err != (string *)0x0) && (exr_header->tiled != 0)) {
              std::__cxx11::string::append((char *)err);
            }
          }
          else if (warn != (string *)0x0) {
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            poVar3 = std::operator<<(local_1a8,"(ConvertHeader) Unsupported or unknown info.type: ")
            ;
            poVar3 = std::operator<<(poVar3,(string *)__lhs);
            std::operator<<(poVar3,"\n");
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::append((string *)warn);
            std::__cxx11::string::~string(asStack_1d8);
            std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          }
          goto LAB_001aba3c;
        }
        exr_header->non_image = 1;
        iVar1 = exr_header->tiled;
      }
      if (iVar1 == 0) goto joined_r0x001ab98a;
    }
  }
LAB_001aba3c:
  uVar4 = ((long)(info->channels).
                 super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(info->channels).
                super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x38;
  exr_header->num_channels = (int)uVar4;
  pEVar5 = (EXRChannelInfo *)malloc((long)(int)uVar4 * 0x110);
  exr_header->channels = pEVar5;
  lVar9 = 0;
  lVar10 = 0;
  for (uVar8 = 0; uVar8 < (ulong)(long)(int)uVar4; uVar8 = uVar8 + 1) {
    strncpy(exr_header->channels->name + lVar9,
            *(char **)(((info->channels).
                        super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start)->pad + lVar10 + -0x31),0xff);
    exr_header->channels->pad[lVar9 + -0xe] = '\0';
    *(undefined4 *)(exr_header->channels->pad + lVar9 + -0xd) =
         *(undefined4 *)
          (((info->channels).
            super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
            _M_impl.super__Vector_impl_data._M_start)->pad + lVar10 + 0xffffffffffffffef);
    exr_header->channels->pad[lVar9 + -1] =
         ((info->channels).
          super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>._M_impl.
          super__Vector_impl_data._M_start)->pad[lVar10 + 0xffffffffffffffff];
    *(undefined4 *)(exr_header->channels->pad + lVar9 + -9) =
         *(undefined4 *)
          (((info->channels).
            super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
            _M_impl.super__Vector_impl_data._M_start)->pad + lVar10 + 0xfffffffffffffff7);
    *(undefined4 *)(exr_header->channels->pad + lVar9 + -5) =
         *(undefined4 *)
          (((info->channels).
            super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
            _M_impl.super__Vector_impl_data._M_start)->pad + lVar10 + 0xfffffffffffffffb);
    uVar4 = (ulong)(uint)exr_header->num_channels;
    lVar10 = lVar10 + 0x38;
    lVar9 = lVar9 + 0x110;
  }
  piVar6 = (int *)malloc((long)(int)uVar4 << 2);
  exr_header->pixel_types = piVar6;
  lVar9 = 8;
  for (uVar8 = 0; uVar8 < (ulong)(long)(int)uVar4; uVar8 = uVar8 + 1) {
    exr_header->pixel_types[uVar8] =
         *(int *)(((info->channels).
                   super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start)->pad + lVar9 * 4 + -0x31);
    uVar4 = (ulong)(uint)exr_header->num_channels;
    lVar9 = lVar9 + 0xe;
  }
  piVar6 = (int *)malloc((long)(int)uVar4 << 2);
  exr_header->requested_pixel_types = piVar6;
  lVar9 = 8;
  for (uVar8 = 0; uVar8 < (ulong)(long)(int)uVar4; uVar8 = uVar8 + 1) {
    exr_header->requested_pixel_types[uVar8] =
         *(int *)(((info->channels).
                   super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start)->pad + lVar9 * 4 + -0x31);
    uVar4 = (ulong)(uint)exr_header->num_channels;
    lVar9 = lVar9 + 0xe;
  }
  uVar4 = ((long)(info->attributes).
                 super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x210;
  uVar11 = (uint)uVar4;
  exr_header->num_custom_attributes = uVar11;
  if ((int)uVar11 < 1) {
    exr_header->custom_attributes = (EXRAttribute *)0x0;
  }
  else {
    if (0x80 < uVar11) {
      exr_header->num_custom_attributes = 0x80;
      uVar4 = 0x80;
    }
    pEVar7 = (EXRAttribute *)malloc((ulong)(uint)((int)uVar4 * 0x210));
    exr_header->custom_attributes = pEVar7;
    lVar9 = 0;
    for (uVar8 = 0; uVar8 < (ulong)(long)(int)uVar4; uVar8 = uVar8 + 1) {
      memcpy(exr_header->custom_attributes->name + lVar9,
             ((info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
              _M_impl.super__Vector_impl_data._M_start)->name + lVar9,0x100);
      memcpy(exr_header->custom_attributes->type + lVar9,
             ((info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
              _M_impl.super__Vector_impl_data._M_start)->type + lVar9,0x100);
      *(undefined4 *)((long)&exr_header->custom_attributes->size + lVar9) =
           *(undefined4 *)
            ((long)&((info->attributes).
                     super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
                     super__Vector_impl_data._M_start)->size + lVar9);
      *(undefined8 *)((long)&exr_header->custom_attributes->value + lVar9) =
           *(undefined8 *)
            ((long)&((info->attributes).
                     super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
                     super__Vector_impl_data._M_start)->value + lVar9);
      uVar4 = (ulong)(uint)exr_header->num_custom_attributes;
      lVar9 = lVar9 + 0x210;
    }
  }
  exr_header->header_len = info->header_len;
  return true;
}

Assistant:

static bool ConvertHeader(EXRHeader *exr_header, const HeaderInfo &info, std::string *warn, std::string *err) {
  exr_header->pixel_aspect_ratio = info.pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info.screen_window_center[0];
  exr_header->screen_window_center[1] = info.screen_window_center[1];
  exr_header->screen_window_width = info.screen_window_width;
  exr_header->chunk_count = info.chunk_count;
  exr_header->display_window.min_x = info.display_window.min_x;
  exr_header->display_window.min_y = info.display_window.min_y;
  exr_header->display_window.max_x = info.display_window.max_x;
  exr_header->display_window.max_y = info.display_window.max_y;
  exr_header->data_window.min_x = info.data_window.min_x;
  exr_header->data_window.min_y = info.data_window.min_y;
  exr_header->data_window.max_x = info.data_window.max_x;
  exr_header->data_window.max_y = info.data_window.max_y;
  exr_header->line_order = info.line_order;
  exr_header->compression_type = info.compression_type;
  exr_header->tiled = info.tiled;
  exr_header->tile_size_x = info.tile_size_x;
  exr_header->tile_size_y = info.tile_size_y;
  exr_header->tile_level_mode = info.tile_level_mode;
  exr_header->tile_rounding_mode = info.tile_rounding_mode;

  EXRSetNameAttr(exr_header, info.name.c_str());


  if (!info.type.empty()) {
    bool valid = true;
    if (info.type == "scanlineimage") {
      if (exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be off for `scanlineimage` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "tiledimage") {
      if (!exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be on for `tiledimage` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "deeptile") {
      exr_header->non_image = 1;
      if (!exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be on for `deeptile` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "deepscanline") {
      exr_header->non_image = 1;
      if (exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be off for `deepscanline` type.\n";
        }
        //valid = false;
      }
    } else {
      if (warn) {
        std::stringstream ss;
        ss << "(ConvertHeader) Unsupported or unknown info.type: " << info.type << "\n";
        (*warn) += ss.str();
      }
    }

    if (!valid) {
      return false;
    }
  }

  exr_header->num_channels = static_cast<int>(info.channels.size());

  exr_header->channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
#ifdef _MSC_VER
    strncpy_s(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#else
    strncpy(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#endif
    // manually add '\0' for safety.
    exr_header->channels[c].name[255] = '\0';

    exr_header->channels[c].pixel_type = info.channels[c].pixel_type;
    exr_header->channels[c].p_linear = info.channels[c].p_linear;
    exr_header->channels[c].x_sampling = info.channels[c].x_sampling;
    exr_header->channels[c].y_sampling = info.channels[c].y_sampling;
  }

  exr_header->pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->pixel_types[c] = info.channels[c].pixel_type;
  }

  // Initially fill with values of `pixel_types`
  exr_header->requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->requested_pixel_types[c] = info.channels[c].pixel_type;
  }

  exr_header->num_custom_attributes = static_cast<int>(info.attributes.size());

  if (exr_header->num_custom_attributes > 0) {
    // TODO(syoyo): Report warning when # of attributes exceeds
    // `TINYEXR_MAX_CUSTOM_ATTRIBUTES`
    if (exr_header->num_custom_attributes > TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
      exr_header->num_custom_attributes = TINYEXR_MAX_CUSTOM_ATTRIBUTES;
    }

    exr_header->custom_attributes = static_cast<EXRAttribute *>(malloc(
        sizeof(EXRAttribute) * size_t(exr_header->num_custom_attributes)));

    for (size_t i = 0; i < size_t(exr_header->num_custom_attributes); i++) {
      memcpy(exr_header->custom_attributes[i].name, info.attributes[i].name,
             256);
      memcpy(exr_header->custom_attributes[i].type, info.attributes[i].type,
             256);
      exr_header->custom_attributes[i].size = info.attributes[i].size;
      // Just copy pointer
      exr_header->custom_attributes[i].value = info.attributes[i].value;
    }

  } else {
    exr_header->custom_attributes = NULL;
  }

  exr_header->header_len = info.header_len;

  return true;
}